

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_surf_status_tec(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  int iVar2;
  REF_INT node0;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  bool bVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_DBL *scalar;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  double dVar11;
  REF_EDGE ref_edge;
  REF_DBL normdev;
  REF_DBL edge_ratio;
  REF_DBL quality;
  char *vars [4];
  REF_INT nodes [27];
  uint local_fc;
  REF_EDGE local_f0;
  REF_DBL local_e8;
  char *local_e0;
  double local_d8;
  double local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  local_c8 = "q";
  local_c0 = "s";
  local_b8 = "l";
  local_b0 = "n";
  iVar10 = ref_node->max;
  local_e0 = filename;
  if (iVar10 < 0) {
    local_fc = 1;
    pcVar9 = "malloc scalar of REF_DBL negative";
  }
  else {
    uVar5 = iVar10 * 4;
    scalar = (REF_DBL *)malloc((ulong)uVar5 * 8);
    if (scalar != (REF_DBL *)0x0) {
      bVar3 = true;
      if (iVar10 != 0) {
        uVar6 = 1;
        if (1 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
        uVar7 = 0;
        do {
          scalar[uVar7] = 1.0;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      goto LAB_00142427;
    }
    local_fc = 2;
    pcVar9 = "malloc scalar of REF_DBL NULL";
  }
  bVar3 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x1170,
         "ref_gather_surf_status_tec",pcVar9);
  scalar = (REF_DBL *)0x0;
LAB_00142427:
  if (bVar3) {
    ref_cell = ref_grid->cell[3];
    if (0 < ref_cell->max) {
      iVar10 = 0;
      do {
        RVar4 = ref_cell_nodes(ref_cell,iVar10,local_a8);
        if (RVar4 == 0) {
          uVar5 = ref_node_tri_quality(ref_node,local_a8,&local_d0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1173,"ref_gather_surf_status_tec",(ulong)uVar5,"tri qual");
            return uVar5;
          }
          local_e8 = 2.0;
          if (((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0))
             && (uVar5 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_e8), uVar5 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1177,"ref_gather_surf_status_tec",(ulong)uVar5,"norm dev");
            return uVar5;
          }
          iVar1 = ref_cell->node_per;
          if (0 < (long)iVar1) {
            lVar8 = 0;
            do {
              iVar2 = local_a8[lVar8];
              dVar11 = scalar[(long)iVar2 * 4];
              if (local_d0 <= scalar[(long)iVar2 * 4]) {
                dVar11 = local_d0;
              }
              scalar[(long)iVar2 * 4] = dVar11;
              uVar5 = iVar2 * 4 | 3;
              dVar11 = scalar[(int)uVar5];
              if (local_e8 <= scalar[(int)uVar5]) {
                dVar11 = local_e8;
              }
              scalar[(int)uVar5] = dVar11;
              lVar8 = lVar8 + 1;
            } while (iVar1 != lVar8);
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < ref_cell->max);
    }
    local_fc = ref_edge_create(&local_f0,ref_grid);
    if (local_fc == 0) {
      if (0 < local_f0->n) {
        lVar8 = 0;
        do {
          node0 = local_f0->e2n[lVar8 * 2];
          iVar10 = local_f0->e2n[lVar8 * 2 + 1];
          uVar5 = ref_node_ratio(ref_node,node0,iVar10,&local_d8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1184,"ref_gather_surf_status_tec",(ulong)uVar5,"ratio");
            return uVar5;
          }
          dVar11 = scalar[(long)node0 * 4 + 1];
          if (local_d8 <= scalar[(long)node0 * 4 + 1]) {
            dVar11 = local_d8;
          }
          scalar[(long)node0 * 4 + 1] = dVar11;
          dVar11 = scalar[(long)iVar10 * 4 + 1];
          if (local_d8 <= scalar[(long)iVar10 * 4 + 1]) {
            dVar11 = local_d8;
          }
          scalar[(long)iVar10 * 4 + 1] = dVar11;
          uVar5 = node0 * 4 | 2;
          dVar11 = scalar[(int)uVar5];
          if (scalar[(int)uVar5] <= local_d8) {
            dVar11 = local_d8;
          }
          scalar[(int)uVar5] = dVar11;
          uVar5 = iVar10 * 4 | 2;
          dVar11 = scalar[(int)uVar5];
          if (scalar[(int)uVar5] <= local_d8) {
            dVar11 = local_d8;
          }
          scalar[(int)uVar5] = dVar11;
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_f0->n);
      }
      local_fc = ref_edge_free(local_f0);
      if (local_fc == 0) {
        local_fc = ref_gather_scalar_surf_tec(ref_grid,4,scalar,&local_c8,local_e0);
        if (local_fc == 0) {
          local_fc = 0;
          if (scalar != (REF_DBL *)0x0) {
            free(scalar);
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x118d,"ref_gather_surf_status_tec",(ulong)local_fc,"dump");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x118a,"ref_gather_surf_status_tec",(ulong)local_fc,"free edges");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1180,"ref_gather_surf_status_tec",(ulong)local_fc,"create edges");
    }
  }
  return local_fc;
}

Assistant:

REF_FCN REF_STATUS ref_gather_surf_status_tec(REF_GRID ref_grid,
                                              const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL *scalar, quality, normdev;
  REF_INT cell, edge, node0, node1, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  const char *vars[4];
  REF_INT ldim = 4;

  vars[0] = "q";
  vars[1] = "s";
  vars[2] = "l";
  vars[3] = "n";
  ref_malloc_init(scalar, ldim * ref_node_max(ref_node), REF_DBL, 1.0);
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "tri qual");
    normdev = 2.0;
    if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
        ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
    }
    each_ref_cell_cell_node(ref_cell, cell_node) {
      scalar[0 + ldim * nodes[cell_node]] =
          MIN(scalar[0 + ldim * nodes[cell_node]], quality);
      scalar[3 + ldim * nodes[cell_node]] =
          MIN(scalar[3 + ldim * nodes[cell_node]], normdev);
    }
  }
  RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    scalar[1 + ldim * node0] = MIN(scalar[1 + ldim * node0], edge_ratio);
    scalar[1 + ldim * node1] = MIN(scalar[1 + ldim * node1], edge_ratio);
    scalar[2 + ldim * node0] = MAX(scalar[2 + ldim * node0], edge_ratio);
    scalar[2 + ldim * node1] = MAX(scalar[2 + ldim * node1], edge_ratio);
  }
  RSS(ref_edge_free(ref_edge), "free edges");

  RSS(ref_gather_scalar_surf_tec(ref_grid, ldim, scalar, vars, filename),
      "dump");

  ref_free(scalar);

  return REF_SUCCESS;
}